

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

int ClipperLib::PointCount(OutPt *Pts)

{
  OutPt *local_28;
  OutPt *p;
  int result;
  OutPt *Pts_local;
  
  if (Pts == (OutPt *)0x0) {
    Pts_local._4_4_ = 0;
  }
  else {
    p._4_4_ = 0;
    local_28 = Pts;
    do {
      p._4_4_ = p._4_4_ + 1;
      local_28 = local_28->Next;
      Pts_local._4_4_ = p._4_4_;
    } while (local_28 != Pts);
  }
  return Pts_local._4_4_;
}

Assistant:

int PointCount(OutPt *Pts)
{
    if (!Pts) return 0;
    int result = 0;
    OutPt* p = Pts;
    do
    {
        result++;
        p = p->Next;
    }
    while (p != Pts);
    return result;
}